

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBooleanStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IsEnabledStateTestCase::iterate
          (IsEnabledStateTestCase *this)

{
  CallLogWrapper *gl;
  TestLog *log;
  bool bVar1;
  ContextType ctxType;
  GLenum GVar2;
  NotSupportedError *this_00;
  ResultCollector result;
  string local_88;
  ResultCollector local_68;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)(this->m_minimumVersion).m_bits);
  if (bVar1) {
    log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88," // ERROR: ","");
    tcu::ResultCollector::ResultCollector(&local_68,log,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    gl = &this->super_CallLogWrapper;
    (this->super_CallLogWrapper).m_enableLog = true;
    deqp::gls::StateQueryUtil::verifyStateBoolean
              (&local_68,gl,*(GLenum *)&(this->super_CallLogWrapper).field_0x14,this->m_initial,
               this->m_verifier);
    glu::CallLogWrapper::glEnable(gl,*(GLenum *)&(this->super_CallLogWrapper).field_0x14);
    GVar2 = glu::CallLogWrapper::glGetError(gl);
    glu::checkError(GVar2,"glEnable(m_targetName)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBooleanStateQueryTests.cpp"
                    ,0x53);
    deqp::gls::StateQueryUtil::verifyStateBoolean
              (&local_68,gl,*(GLenum *)&(this->super_CallLogWrapper).field_0x14,true,
               this->m_verifier);
    glu::CallLogWrapper::glDisable(gl,*(GLenum *)&(this->super_CallLogWrapper).field_0x14);
    GVar2 = glu::CallLogWrapper::glGetError(gl);
    glu::checkError(GVar2,"glDisable(m_targetName)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBooleanStateQueryTests.cpp"
                    ,0x57);
    deqp::gls::StateQueryUtil::verifyStateBoolean
              (&local_68,gl,*(GLenum *)&(this->super_CallLogWrapper).field_0x14,false,
               this->m_verifier);
    tcu::ResultCollector::setTestContextResult
              (&local_68,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_message._M_dataplus._M_p != &local_68.m_message.field_2) {
      operator_delete(local_68.m_message._M_dataplus._M_p,
                      local_68.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_prefix._M_dataplus._M_p != &local_68.m_prefix.field_2) {
      operator_delete(local_68.m_prefix._M_dataplus._M_p,
                      local_68.m_prefix.field_2._M_allocated_capacity + 1);
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"This test requires a higher context version.",
             "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBooleanStateQueryTests.cpp"
             ,0x49);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "This test requires a higher context version.");

		tcu::ResultCollector result(m_testCtx.getLog(), " // ERROR: ");
		enableLogging(true);

		// check inital value
		verifyStateBoolean(result, *this, m_targetName, m_initial, m_verifier);

		// check toggle

		GLU_CHECK_CALL(glEnable(m_targetName));

		verifyStateBoolean(result, *this, m_targetName, true, m_verifier);

		GLU_CHECK_CALL(glDisable(m_targetName));

		verifyStateBoolean(result, *this, m_targetName, false, m_verifier);

		result.setTestContextResult(m_testCtx);
		return STOP;
	}